

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Station.cpp
# Opt level: O1

list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> * __thiscall
imrt::Station::getModifyIntensityApertureDiff_abi_cxx11_
          (list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
           *__return_storage_ptr__,Station *this,int aperture,double size)

{
  size_t *psVar1;
  pointer pvVar2;
  long lVar3;
  int iVar4;
  mapped_type *pmVar5;
  _List_node_base *p_Var6;
  ulong uVar7;
  mapped_type mVar8;
  double dVar9;
  double dVar10;
  _List_node_base *local_48;
  key_type local_38;
  
  (__return_storage_ptr__->
  super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>)._M_impl.
  _M_node.super__List_node_base._M_prev = (_List_node_base *)__return_storage_ptr__;
  (__return_storage_ptr__->
  super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>)._M_impl.
  _M_node.super__List_node_base._M_next = (_List_node_base *)__return_storage_ptr__;
  (__return_storage_ptr__->
  super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>)._M_impl.
  _M_node._M_size = 0;
  p_Var6 = (_List_node_base *)
           (this->intensity).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[aperture];
  dVar10 = (double)p_Var6 + size;
  if (0.0 <= dVar10) {
    local_48 = (_List_node_base *)size;
    if (dVar10 <= (double)this->max_intensity) goto LAB_0011e111;
    if (0.0 <= dVar10) {
      dVar9 = (double)this->max_intensity;
      if (dVar10 <= dVar9) {
        return __return_storage_ptr__;
      }
      if (dVar9 <= (double)p_Var6) {
        return __return_storage_ptr__;
      }
      local_48 = (_List_node_base *)(dVar9 - (double)p_Var6);
      goto LAB_0011e111;
    }
  }
  local_48 = p_Var6;
  if ((double)p_Var6 <= 0.0) {
    return __return_storage_ptr__;
  }
LAB_0011e111:
  for (uVar7 = 0; iVar4 = Collimator::getXdim(this->collimator), (long)uVar7 < (long)iVar4;
      uVar7 = uVar7 + 1) {
    pvVar2 = (this->A).
             super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar3 = *(long *)&pvVar2[aperture].
                      super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                      ._M_impl.super__Vector_impl_data;
    if ((-1 < *(int *)(lVar3 + uVar7 * 8)) && (-1 < *(int *)(lVar3 + 4 + uVar7 * 8))) {
      local_38 = (key_type)
                 ((ulong)*(uint *)(*(long *)&pvVar2[aperture].
                                             super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                             ._M_impl.super__Vector_impl_data + uVar7 * 8) << 0x20 |
                 uVar7);
      pmVar5 = std::
               map<std::pair<int,_int>,_int,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_int>_>_>
               ::operator[](&this->pos2beam,&local_38);
      lVar3 = *(long *)&(this->A).
                        super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[aperture].
                        super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                        ._M_impl.super__Vector_impl_data;
      iVar4 = *(int *)(lVar3 + uVar7 * 8);
      if (iVar4 <= *(int *)(lVar3 + 4 + uVar7 * 8)) {
        mVar8 = *pmVar5;
        iVar4 = iVar4 + -1;
        do {
          p_Var6 = (_List_node_base *)operator_new(0x20);
          *(mapped_type *)&p_Var6[1]._M_next = mVar8;
          p_Var6[1]._M_prev = local_48;
          std::__detail::_List_node_base::_M_hook(p_Var6);
          psVar1 = &(__return_storage_ptr__->
                    super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                    )._M_impl._M_node._M_size;
          *psVar1 = *psVar1 + 1;
          mVar8 = mVar8 + 1;
          iVar4 = iVar4 + 1;
        } while (iVar4 < *(int *)(*(long *)&(this->A).
                                            super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start[aperture].
                                            super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                            ._M_impl.super__Vector_impl_data + 4 + uVar7 * 8));
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

list <pair< int,double> > Station::getModifyIntensityApertureDiff (int aperture, double size) {
    list < pair <int, double > > diff;
    if ((intensity[aperture]+size) < 0 || (intensity[aperture]+size) > max_intensity) {
      if (intensity[aperture]+size < 0) {
        // Too low intensity
        if (intensity[aperture]>0)
          size = intensity[aperture];
        else
          return(diff);
      } else if ((intensity[aperture]+size) > max_intensity) {
        // Too high intensity
        if (intensity[aperture] < max_intensity)
          size = max_intensity - intensity[aperture];
        else 
          return(diff);
      } else {
        return (diff);
      }
    }
    for (int i=0; i<collimator.getXdim(); i++) {
      if (A[aperture][i].first<0 || A[aperture][i].second<0) 
        continue;
      int beamlet = pos2beam[make_pair(i, A[aperture][i].first)];
      for(int j=A[aperture][i].first; j<=A[aperture][i].second; j++){
        diff.push_back(make_pair(beamlet, size));
        beamlet++;
      }
    }
    return(diff);
    
  }